

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismSearcher::softmax_shuffle
          (HomomorphismSearcher *this,vector<int,_std::allocator<int>_> *branch_v,uint branch_v_end)

{
  int iVar1;
  pointer piVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  result_type_conflict rVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint local_6c;
  uniform_int_distribution<long_long> dist;
  
  uVar3 = HomomorphismModel::largest_target_degree(this->model);
  uVar9 = (ulong)branch_v_end;
  uVar11 = 1;
  lVar8 = 0;
  for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
    uVar4 = HomomorphismModel::target_degree
                      (this->model,0,
                       (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar7]);
    uVar4 = (uVar4 - uVar3) + 0x2d;
    lVar8 = lVar8 + (1L << ((ulong)(~((int)uVar4 >> 0x1f) & uVar4) & 0x3f));
  }
  uVar7 = 0;
  local_6c = 0xffffffff;
  do {
    if (uVar7 == uVar9) {
      return;
    }
    dist._M_param._M_a = 1;
    dist._M_param._M_b = lVar8;
    rVar6 = std::uniform_int_distribution<long_long>::operator()(&dist,&this->global_rand);
    uVar10 = uVar11;
    uVar4 = local_6c;
    do {
      uVar5 = branch_v_end - 1;
      if (uVar9 <= uVar10) break;
      uVar5 = HomomorphismModel::target_degree
                        (this->model,0,
                         (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar10 - 1]);
      uVar5 = (uVar5 - uVar3) + 0x2d;
      uVar4 = uVar4 + 1;
      uVar10 = uVar10 + 1;
      rVar6 = rVar6 + (-1L << ((ulong)(~((int)uVar5 >> 0x1f) & uVar5) & 0x3f));
      uVar5 = uVar4;
    } while (0 < rVar6);
    uVar4 = HomomorphismModel::target_degree
                      (this->model,0,
                       (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar5]);
    uVar4 = (uVar4 - uVar3) + 0x2d;
    piVar2 = (branch_v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_6c = local_6c + 1;
    iVar1 = piVar2[uVar5];
    lVar8 = lVar8 + (-1L << ((ulong)(~((int)uVar4 >> 0x1f) & uVar4) & 0x3f));
    uVar11 = uVar11 + 1;
    piVar2[uVar5] = piVar2[uVar7];
    piVar2[uVar7] = iVar1;
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

auto HomomorphismSearcher::softmax_shuffle(
    vector<int> & branch_v,
    unsigned branch_v_end) -> void
{
    // repeatedly pick a softmax-biased vertex, move it to the front of branch_v,
    // and then only consider items further to the right in the next iteration.

    // Using floating point here turned out to be way too slow. Fortunately the base
    // of softmax doesn't seem to matter, so we use 2 instead of e, and do everything
    // using bit voodoo.
    auto expish = [largest_target_degree = this->model.largest_target_degree()](int degree) {
        constexpr int sufficient_space_for_adding_up = numeric_limits<long long>::digits - 18;
        auto shift = max<int>(degree - largest_target_degree + sufficient_space_for_adding_up, 0);
        return 1ll << shift;
    };

    long long total = 0;
    for (unsigned v = 0; v < branch_v_end; ++v)
        total += expish(model.target_degree(0, branch_v[v]));

    for (unsigned start = 0; start < branch_v_end; ++start) {
        // pick a random number between 1 and total inclusive
        uniform_int_distribution<long long> dist(1, total);
        long long select_score = dist(global_rand);

        // go over the list until we hit the score
        unsigned select_element = start;
        for (; select_element + 1 < branch_v_end; ++select_element) {
            select_score -= expish(model.target_degree(0, branch_v[select_element]));
            if (select_score <= 0)
                break;
        }

        // move to front
        total -= expish(model.target_degree(0, branch_v[select_element]));
        swap(branch_v[select_element], branch_v[start]);
    }
}